

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall cmMakefile::AddDefineFlag(cmMakefile *this,char *flag,string *dflags)

{
  pointer pcVar1;
  size_type sVar2;
  long *plVar3;
  char *pcVar4;
  long *plVar5;
  size_type sVar6;
  long *local_68;
  long local_58;
  long lStack_50;
  long *local_48 [2];
  long local_38 [2];
  
  sVar6 = dflags->_M_string_length;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48," ","");
  plVar3 = (long *)std::__cxx11::string::append((char *)local_48);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_58 = *plVar5;
    lStack_50 = plVar3[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar5;
    local_68 = (long *)*plVar3;
  }
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::_M_append((char *)dflags,(ulong)local_68);
  if (local_68 != &local_58) {
    operator_delete(local_68,local_58 + 1);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  pcVar1 = (dflags->_M_dataplus)._M_p;
  sVar2 = dflags->_M_string_length;
  pcVar4 = pcVar1 + sVar6 + 1;
  if (pcVar4 != pcVar1 + sVar2) {
    sVar6 = sVar6 + 1;
    do {
      if (pcVar1[sVar6] == '\n') {
        pcVar1[sVar6] = ' ';
      }
      sVar6 = sVar6 + 1;
    } while (sVar2 != sVar6);
  }
  pcVar1 = (dflags->_M_dataplus)._M_p;
  sVar6 = dflags->_M_string_length;
  for (; pcVar4 != pcVar1 + sVar6; pcVar4 = pcVar4 + 1) {
    if (*pcVar4 == '\r') {
      *pcVar4 = ' ';
    }
  }
  return;
}

Assistant:

void cmMakefile::AddDefineFlag(const char* flag, std::string& dflags)
{
  // remove any \n\r
  std::string::size_type initSize = dflags.size();
  dflags += std::string(" ") + flag;
  std::string::iterator flagStart = dflags.begin() + initSize + 1;
  std::replace(flagStart, dflags.end(), '\n', ' ');
  std::replace(flagStart, dflags.end(), '\r', ' ');
}